

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetToleranceFormat(ON_DimStyle *this,tolerance_format format)

{
  if (this->m_tolerance_format != format) {
    this->m_tolerance_format = format;
    Internal_ContentChange(this);
    Internal_TextPositionPropertiesChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,ToleranceFormat);
  return;
}

Assistant:

void ON_DimStyle::SetToleranceFormat(ON_DimStyle::tolerance_format format)
{
  if (m_tolerance_format != format)
  {
    m_tolerance_format = format;
    Internal_ContentChange();
    Internal_TextPositionPropertiesChange();
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::ToleranceFormat);
}